

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::filename(path *this)

{
  bool bVar1;
  iterator *this_00;
  path *in_RSI;
  path *in_RDI;
  path *p;
  iterator *in_stack_ffffffffffffff70;
  path local_58 [2];
  
  bVar1 = has_relative_path(in_RDI);
  if (bVar1) {
    p = local_58;
    end(in_RSI);
    this_00 = iterator::operator--(in_stack_ffffffffffffff70);
    iterator::operator*(this_00);
    path((path *)this_00,p);
    iterator::~iterator((iterator *)0x134de1);
  }
  else {
    path((path *)0x134d89);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}